

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::BuildLiveFieldSets(CrateReader *this)

{
  string *psVar1;
  Index *pIVar2;
  pointer pFVar3;
  bool bVar4;
  mapped_type *this_00;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  Index *pIVar8;
  Index *pIVar9;
  Index *local_220;
  optional<tinyusdz::Token> tokv;
  string local_1c8;
  ostringstream ss_e;
  
  pIVar8 = (this->_fieldset_indices).
           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
           _M_impl.super__Vector_impl_data._M_start;
  _ss_e = 0xffffffff;
  local_220 = (Index *)::std::
                       __find_if<__gnu_cxx::__normal_iterator<tinyusdz::crate::Index*,std::vector<tinyusdz::crate::Index,std::allocator<tinyusdz::crate::Index>>>,__gnu_cxx::__ops::_Iter_equals_val<tinyusdz::crate::Index_const>>
                                 (pIVar8,(this->_fieldset_indices).
                                         super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
  psVar1 = &this->_err;
  do {
    lVar7 = 0x20;
    pIVar2 = (this->_fieldset_indices).
             super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pIVar8 == pIVar2) {
LAB_001952b0:
      return pIVar8 == pIVar2;
    }
    _ss_e = (undefined4)
            ((ulong)((long)pIVar8 -
                    (long)(this->_fieldset_indices).
                          super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2);
    this_00 = ::std::
              map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
              ::operator[](&this->_live_fieldsets,(key_type *)&ss_e);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
    ::resize(this_00,(long)local_220 - (long)pIVar8 >> 2);
    for (pIVar9 = pIVar8; pIVar9 != local_220; pIVar9 = pIVar9 + 1) {
      uVar6 = (ulong)pIVar9->value;
      pFVar3 = (this->_fields).
               super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_fields).
                        super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3 >> 4) <= uVar6) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"BuildLiveFieldSets");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1715);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)&ss_e,"Invalid live field set data.");
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)psVar1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        goto LAB_001952b0;
      }
      GetToken(&tokv,this,(Index)pFVar3[uVar6].token_index.super_Index.value);
      if (tokv.has_value_ == true) {
        nonstd::optional_lite::optional<tinyusdz::Token>::value(&tokv);
        ::std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)(this_00->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x20));
        bVar4 = UnpackValueRep(this,&pFVar3[uVar6].value_rep,
                               (CrateValue *)
                               ((long)&(((this_00->
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->first).
                                       _M_dataplus._M_p + lVar7));
        if (!bVar4) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"BuildLiveFieldSets");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1720);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)&ss_e,
                                     "BuildLiveFieldSets: Failed to unpack ValueRep : ");
          ValueRep::GetStringRepr_abi_cxx11_(&local_1c8,&pFVar3[uVar6].value_rep);
          poVar5 = ::std::operator<<(poVar5,(string *)&local_1c8);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)psVar1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&tokv);
          goto LAB_001952b0;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"BuildLiveFieldSets");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1724);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)&ss_e,"Invalid token index.");
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)psVar1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
      nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&tokv);
      lVar7 = lVar7 + 0x38;
    }
    pIVar8 = local_220 + 1;
    _ss_e = 0xffffffff;
    local_220 = (Index *)::std::
                         __find_if<__gnu_cxx::__normal_iterator<tinyusdz::crate::Index*,std::vector<tinyusdz::crate::Index,std::allocator<tinyusdz::crate::Index>>>,__gnu_cxx::__ops::_Iter_equals_val<tinyusdz::crate::Index_const>>
                                   (pIVar8,(this->_fieldset_indices).
                                           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&ss_e);
  } while( true );
}

Assistant:

bool CrateReader::BuildLiveFieldSets() {
  for (auto fsBegin = _fieldset_indices.begin(),
            fsEnd = std::find(fsBegin, _fieldset_indices.end(), crate::Index());
       fsBegin != _fieldset_indices.end();
       fsBegin = fsEnd + 1, fsEnd = std::find(fsBegin, _fieldset_indices.end(),
                                              crate::Index())) {
    auto &pairs = _live_fieldsets[crate::Index(
        uint32_t(fsBegin - _fieldset_indices.begin()))];

    pairs.resize(size_t(fsEnd - fsBegin));
    DCOUT("range size = " << (fsEnd - fsBegin));
    // TODO(syoyo): Parallelize.
    for (size_t i = 0; fsBegin != fsEnd; ++fsBegin, ++i) {
      if (fsBegin->value < _fields.size()) {
        // ok
      } else {
        PUSH_ERROR("Invalid live field set data.");
        return false;
      }

      DCOUT("fieldIndex = " << (fsBegin->value));
      auto const &field = _fields[fsBegin->value];
      if (auto tokv = GetToken(field.token_index)) {
        pairs[i].first = tokv.value().str();

        if (!UnpackValueRep(field.value_rep, &pairs[i].second)) {
          PUSH_ERROR("BuildLiveFieldSets: Failed to unpack ValueRep : "
                     << field.value_rep.GetStringRepr());
          return false;
        }
      } else {
        PUSH_ERROR("Invalid token index.");
      }
    }
  }

  DCOUT("# of live fieldsets = " << _live_fieldsets.size());

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  size_t sum = 0;
  for (const auto &item : _live_fieldsets) {
    DCOUT("livefieldsets[" << item.first.value
                           << "].count = " << item.second.size());
    sum += item.second.size();

    for (size_t i = 0; i < item.second.size(); i++) {
      DCOUT(" [" << i << "] name = " << item.second[i].first);
    }
  }
  DCOUT("Total fields used = " << sum);
#endif

  return true;
}